

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall Engine::printStats(Engine *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  duration d;
  duration d_00;
  duration d_01;
  duration d_02;
  duration d_03;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  IntVar **ppIVar8;
  char *pcVar9;
  Propagator **ppPVar10;
  vec<IntVar_*> *in_RDI;
  uint i_1;
  uint i;
  int sl;
  int ll;
  int el;
  int nl;
  duration search_time;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> total_time;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff68;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff70;
  FILE *__stream;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff78;
  uint local_6c;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            (in_stack_ffffffffffffff68,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
            (in_stack_ffffffffffffff58);
  std::chrono::operator-(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  uVar2._0_4_ = in_RDI[0x12].sz;
  uVar2._4_4_ = in_RDI[0x12].cap;
  printf("%%%%%%mzn-stat: nodes=%lld\n",uVar2);
  printf("%%%%%%mzn-stat: failures=%lld\n",in_RDI[0x11].data);
  printf("%%%%%%mzn-stat: restarts=%d\n",(ulong)in_RDI[0x14].cap);
  uVar4 = vec<IntVar_*>::size(in_RDI);
  iVar5 = SAT::nVars((SAT *)0x27f64a);
  printf("%%%%%%mzn-stat: variables=%d\n",(ulong)(uVar4 + iVar5));
  uVar6 = vec<IntVar_*>::size(in_RDI);
  printf("%%%%%%mzn-stat: intVars=%d\n",(ulong)uVar6);
  iVar5 = SAT::nVars((SAT *)0x27f684);
  printf("%%%%%%mzn-stat: boolVariables=%d\n",(ulong)(iVar5 - 2));
  uVar6 = vec<Propagator_*>::size((vec<Propagator_*> *)(in_RDI + 2));
  printf("%%%%%%mzn-stat: propagators=%d\n",(ulong)uVar6);
  printf("%%%%%%mzn-stat: propagations=%lld\n",in_RDI[0x12].data);
  printf("%%%%%%mzn-stat: peakDepth=%d\n",(ulong)in_RDI[0x14].sz);
  printf("%%%%%%mzn-stat: nogoods=%lld\n",in_RDI[0x11].data);
  printf("%%%%%%mzn-stat: backjumps=%lld\n",sat.back_jumps);
  memUsed();
  printf("%%%%%%mzn-stat: peakMem=%.2f\n");
  d.__r._4_4_ = in_stack_ffffffffffffff64;
  d.__r._0_4_ = in_stack_ffffffffffffff60;
  to_sec(d);
  printf("%%%%%%mzn-stat: time=%.3f\n");
  d_00.__r._4_4_ = in_stack_ffffffffffffff64;
  d_00.__r._0_4_ = in_stack_ffffffffffffff60;
  to_sec(d_00);
  printf("%%%%%%mzn-stat: initTime=%.3f\n");
  d_01.__r._4_4_ = in_stack_ffffffffffffff64;
  d_01.__r._0_4_ = in_stack_ffffffffffffff60;
  to_sec(d_01);
  printf("%%%%%%mzn-stat: solveTime=%.3f\n");
  if (in_RDI[7].data != (IntVar **)0x0) {
    printf("%%%%%%mzn-stat: objective=%d\n",(ulong)in_RDI[8].cap);
    d_02.__r._4_4_ = in_stack_ffffffffffffff64;
    d_02.__r._0_4_ = in_stack_ffffffffffffff60;
    to_sec(d_02);
    printf("%%%%%%mzn-stat: optTime=%.3f\n");
  }
  uVar1._0_4_ = in_RDI[0x11].sz;
  uVar1._4_4_ = in_RDI[0x11].cap;
  printf("%%%%%%mzn-stat: baseMem=%.2f\n",uVar1);
  uVar6 = vec<TrailElem>::capacity((vec<TrailElem> *)&in_RDI[0xd].data);
  printf("%%%%%%mzn-stat: trailMem=%.2f\n",(double)((ulong)uVar6 << 4) / 1048576.0);
  printf("%%%%%%mzn-stat: randomSeed=%d\n",(ulong)(uint)so.rnd_seed);
  if (1 < so.verbosity) {
    local_4c = 0;
    local_50 = 0;
    local_54 = 0;
    local_58 = 0;
    local_5c = 0;
    while (uVar6 = local_5c, uVar7 = vec<IntVar_*>::size(in_RDI), uVar6 < uVar7) {
      ppIVar8 = vec<IntVar_*>::operator[](in_RDI,local_5c);
      iVar5 = (*((*ppIVar8)->super_Var).super_Branching._vptr_Branching[3])();
      switch(iVar5) {
      case 1:
        local_4c = local_4c + 1;
        break;
      case 2:
        local_50 = local_50 + 1;
        break;
      case 3:
        local_54 = local_54 + 1;
        break;
      case 4:
        local_58 = local_58 + 1;
        break;
      default:
        __stream = _stderr;
        pcVar9 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/stats.cpp"
                         ,0x2f);
        if (pcVar9 == (char *)0x0) {
          pcVar9 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/stats.cpp"
          ;
        }
        else {
          pcVar9 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/stats.cpp"
                           ,0x2f);
          pcVar9 = pcVar9 + 1;
        }
        fprintf(__stream,"%s:%d: ",pcVar9,0x43);
        fprintf(_stderr,"Assertion failed.\n");
        abort();
      }
      local_5c = local_5c + 1;
    }
    printf("%%%%%%mzn-stat: noLitIntVars=%d\n",(ulong)local_4c);
    printf("%%%%%%mzn-stat: eagerLitIntVars=%d\n",(ulong)local_50);
    printf("%%%%%%mzn-stat: lazyLitIntVars=%d\n",(ulong)local_54);
    printf("%%%%%%mzn-stat: sparseLitIntVars=%d\n",(ulong)local_58);
    uVar3._0_4_ = in_RDI[0x13].sz;
    uVar3._4_4_ = in_RDI[0x13].cap;
    printf("%%%%%%mzn-stat: solutions=%lld\n",uVar3);
    if ((so.ldsb & 1U) != 0) {
      d_03.__r._4_4_ = in_stack_ffffffffffffff64;
      d_03.__r._0_4_ = in_stack_ffffffffffffff60;
      to_sec(d_03);
      printf("%%%%%%mzn-stat: ldsbTime=%.3f\n");
    }
    SAT::printStats((SAT *)CONCAT44(uVar4,uVar6));
    if ((so.mip & 1U) != 0) {
      (*(mip->super_Propagator)._vptr_Propagator[9])();
    }
    local_6c = 0;
    while (uVar4 = local_6c, uVar6 = vec<Propagator_*>::size(&engine.propagators), uVar4 < uVar6) {
      ppPVar10 = vec<Propagator_*>::operator[](&engine.propagators,local_6c);
      (*(*ppPVar10)->_vptr_Propagator[9])();
      local_6c = local_6c + 1;
    }
  }
  printf("%%%%%%mzn-stat-end\n");
  return;
}

Assistant:

void Engine::printStats() {
	auto total_time = std::chrono::duration_cast<duration>(chuffed_clock::now() - start_time);
	const duration search_time = total_time - init_time;

	// MiniZinc standard statistics
	printf("%%%%%%mzn-stat: nodes=%lld\n", nodes);
	printf("%%%%%%mzn-stat: failures=%lld\n", conflicts);
	printf("%%%%%%mzn-stat: restarts=%d\n", restart_count);
	printf("%%%%%%mzn-stat: variables=%d\n", vars.size() + sat.nVars());
	printf("%%%%%%mzn-stat: intVars=%d\n", vars.size());
	printf("%%%%%%mzn-stat: boolVariables=%d\n", sat.nVars() - 2);  // Do not count constant
																																	// True/False
	//    printf("%%%%%%mzn-stat: floatVariables=%d\n", );
	//    printf("%%%%%%mzn-stat: setVariables=%d\n", );
	printf("%%%%%%mzn-stat: propagators=%d\n", propagators.size());
	printf("%%%%%%mzn-stat: propagations=%lld\n", propagations);
	printf("%%%%%%mzn-stat: peakDepth=%d\n", peak_depth);
	printf("%%%%%%mzn-stat: nogoods=%lld\n",
				 conflicts);  // TODO: Is this correct (e.g., sat.learnts.size())
	printf("%%%%%%mzn-stat: backjumps=%lld\n", sat.back_jumps);
	printf("%%%%%%mzn-stat: peakMem=%.2f\n", memUsed());
	printf("%%%%%%mzn-stat: time=%.3f\n", to_sec(total_time));
	printf("%%%%%%mzn-stat: initTime=%.3f\n", to_sec(init_time));
	printf("%%%%%%mzn-stat: solveTime=%.3f\n", to_sec(search_time));

	// Chuffed specific statistics
	if (opt_var != nullptr) {
		printf("%%%%%%mzn-stat: objective=%d\n", best_sol);
		printf("%%%%%%mzn-stat: optTime=%.3f\n", to_sec(opt_time));
	}
	printf("%%%%%%mzn-stat: baseMem=%.2f\n", base_memory);
	printf("%%%%%%mzn-stat: trailMem=%.2f\n", trail.capacity() * sizeof(TrailElem) / 1048576.0);
	printf("%%%%%%mzn-stat: randomSeed=%d\n", so.rnd_seed);

	if (so.verbosity >= 2) {
		int nl = 0;
		int el = 0;
		int ll = 0;
		int sl = 0;
		for (unsigned int i = 0; i < vars.size(); i++) {
			switch (vars[i]->getType()) {
				case INT_VAR:
					nl++;
					break;
				case INT_VAR_EL:
					el++;
					break;
				case INT_VAR_LL:
					ll++;
					break;
				case INT_VAR_SL:
					sl++;
					break;
				default:
					NEVER;
			}
		}
		printf("%%%%%%mzn-stat: noLitIntVars=%d\n", nl);
		printf("%%%%%%mzn-stat: eagerLitIntVars=%d\n", el);
		printf("%%%%%%mzn-stat: lazyLitIntVars=%d\n", ll);
		printf("%%%%%%mzn-stat: sparseLitIntVars=%d\n", sl);
		printf("%%%%%%mzn-stat: solutions=%lld\n", solutions);

		if (so.ldsb) {
			printf("%%%%%%mzn-stat: ldsbTime=%.3f\n", to_sec(ldsb.ldsb_time));
		}
		sat.printStats();
		/* sat.printLearntStats(); */
		if (so.mip) {
			mip->printStats();
		}
		for (unsigned int i = 0; i < engine.propagators.size(); i++) {
			engine.propagators[i]->printStats();
		}
	}
	printf("%%%%%%mzn-stat-end\n");
}